

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DatabaseSnapshot.cpp
# Opt level: O2

void __thiscall DatabaseSnapshot::compact_locked_datasets(DatabaseSnapshot *this,Task *task)

{
  string *psVar1;
  runtime_error *this_00;
  string *name;
  OnDiskDataset *ds;
  vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_> datasets;
  
  datasets.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)0x0;
  datasets.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x0;
  datasets.super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  name = *(string **)(*(long *)task + 0x60);
  psVar1 = *(string **)(*(long *)task + 0x68);
  do {
    if (name == psVar1) {
      internal_compact(this,task,&datasets);
      std::_Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::
      ~_Vector_base(&datasets.
                     super__Vector_base<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>
                   );
      return;
    }
    if ((name != (string *)0x0) && (*(char *)&name[1]._M_dataplus._M_p == '\0')) {
      ds = find_dataset(this,name);
      if (ds == (OnDiskDataset *)0x0) {
        this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(this_00,"Locked DS doesn\'t exist");
        __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::vector<const_OnDiskDataset_*,_std::allocator<const_OnDiskDataset_*>_>::push_back
                (&datasets,&ds);
    }
    name = (string *)&name[1]._M_string_length;
  } while( true );
}

Assistant:

void DatabaseSnapshot::compact_locked_datasets(Task *task) const {
    std::vector<const OnDiskDataset *> datasets;
    for (const auto &lock : task->spec().locks()) {
        if (const auto *dslock = std::get_if<DatasetLock>(&lock)) {
            const OnDiskDataset *ds = find_dataset(dslock->target());
            if (ds == nullptr) {
                throw std::runtime_error("Locked DS doesn't exist");
            }
            datasets.push_back(ds);
        }
    }
    internal_compact(task, std::move(datasets));
}